

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t
decoder_decode(aom_codec_alg_priv_t *ctx,uint8_t *data,size_t data_sz,void *user_priv)

{
  AVxWorker *pAVar1;
  long *plVar2;
  ulong data_sz_00;
  int iVar3;
  uint8_t *puVar4;
  AVxWorkerInterface *pAVar5;
  long lVar6;
  aom_codec_err_t aVar7;
  char *pcVar8;
  uint8_t *puVar9;
  uint64_t temporal_unit_size;
  size_t length_of_size;
  undefined8 local_60;
  ulong local_58;
  aom_codec_stream_info_t *local_50;
  EXTERNAL_REFERENCES *local_48;
  void *local_40;
  AVxWorkerInterface *local_38;
  
  release_pending_output_frames(ctx);
  if (data == (uint8_t *)0x0 && data_sz == 0) {
    ctx->flushed = 1;
    aVar7 = AOM_CODEC_OK;
  }
  else {
    aVar7 = AOM_CODEC_INVALID_PARAM;
    if ((data != (uint8_t *)0x0 && data_sz != 0) &&
       ((ctx->flushed = 0, ctx->frame_worker != (AVxWorker *)0x0 ||
        (aVar7 = init_decoder(ctx), aVar7 == AOM_CODEC_OK)))) {
      if (ctx->is_annexb == 0) {
        puVar4 = data + data_sz;
      }
      else {
        iVar3 = aom_uleb_decode(data,data_sz,&local_60,&local_58);
        if (iVar3 != 0) {
          return AOM_CODEC_CORRUPT_FRAME;
        }
        if (data_sz - local_58 < CONCAT44(local_60._4_4_,(int)local_60)) {
          return AOM_CODEC_CORRUPT_FRAME;
        }
        data = data + local_58;
        puVar4 = data + CONCAT44(local_60._4_4_,(int)local_60);
      }
      aVar7 = AOM_CODEC_OK;
      if (data < puVar4) {
        local_50 = &ctx->si;
        local_48 = &ctx->ext_refs;
        local_40 = user_priv;
        do {
          if (ctx->is_annexb == 0) {
            local_58 = (long)puVar4 - (long)data;
          }
          else {
            iVar3 = aom_uleb_decode(data,(long)puVar4 - (long)data,&local_58,&local_60);
            if ((iVar3 != 0) ||
               (data = data + CONCAT44(local_60._4_4_,(int)local_60),
               (ulong)((long)puVar4 - (long)data) < local_58)) {
              return AOM_CODEC_CORRUPT_FRAME;
            }
          }
          data_sz_00 = local_58;
          pAVar5 = aom_get_worker_interface();
          if ((ctx->si).h == 0) {
            local_60._0_4_ = 0;
            (ctx->si).is_annexb = ctx->is_annexb;
            aVar7 = decoder_peek_si_internal(data,data_sz_00,local_50,(int *)&local_60);
            if (aVar7 != AOM_CODEC_OK) {
              return aVar7;
            }
            if ((int)local_60 == 0 && (ctx->si).is_kf == 0) {
              return AOM_CODEC_ERROR;
            }
          }
          pAVar1 = ctx->frame_worker;
          plVar2 = (long *)pAVar1->data1;
          plVar2[1] = (long)data;
          plVar2[3] = data_sz_00;
          plVar2[4] = (long)local_40;
          *(undefined4 *)(plVar2 + 5) = 1;
          lVar6 = *plVar2;
          *(uint *)(lVar6 + 0x9e44) = ctx->tile_mode;
          *(undefined8 *)(lVar6 + 0x58da0) = *(undefined8 *)&ctx->decode_tile_row;
          *(undefined8 *)(lVar6 + 0x58df0) = *(undefined8 *)&ctx->ext_tile_debug;
          local_38 = pAVar5;
          memcpy((void *)(lVar6 + 0x58df8),local_48,0x6808);
          *(uint *)(*plVar2 + 0x5f72c) = ctx->is_annexb;
          pAVar1->had_error = 0;
          (*local_38->execute)(pAVar1);
          lVar6 = *plVar2;
          puVar9 = (uint8_t *)plVar2[2];
          if (pAVar1->had_error == 0) {
            if (((ctx->need_resync == 1) && (*(int *)(lVar6 + 0x58d90) == 0)) &&
               ((*(byte *)(lVar6 + 0x3b60) & 0xfd) == 0)) {
              ctx->need_resync = 0;
            }
          }
          else {
            aVar7 = *(aom_codec_err_t *)(lVar6 + 0x5ff08);
            if (aVar7 != AOM_CODEC_OK) {
              pcVar8 = (char *)0x0;
              if (*(int *)(lVar6 + 0x5ff0c) != 0) {
                pcVar8 = (char *)(lVar6 + 0x5ff10);
              }
              (ctx->base).err_detail = pcVar8;
              return aVar7;
            }
          }
          aVar7 = AOM_CODEC_OK;
          data = puVar9;
          if (puVar9 < puVar4) {
            lVar6 = (long)puVar4 - (long)puVar9;
            do {
              data = puVar9;
              if (*puVar9 != '\0') break;
              puVar9 = puVar9 + 1;
              lVar6 = lVar6 + -1;
              data = puVar4;
            } while (lVar6 != 0);
          }
        } while (data < puVar4);
      }
    }
  }
  return aVar7;
}

Assistant:

static aom_codec_err_t decoder_decode(aom_codec_alg_priv_t *ctx,
                                      const uint8_t *data, size_t data_sz,
                                      void *user_priv) {
  aom_codec_err_t res = AOM_CODEC_OK;

#if CONFIG_INSPECTION
  if (user_priv != 0) {
    return decoder_inspect(ctx, data, data_sz, user_priv);
  }
#endif

  release_pending_output_frames(ctx);

  /* Sanity checks */
  /* NULL data ptr allowed if data_sz is 0 too */
  if (data == NULL && data_sz == 0) {
    ctx->flushed = 1;
    return AOM_CODEC_OK;
  }
  if (data == NULL || data_sz == 0) return AOM_CODEC_INVALID_PARAM;

  // Reset flushed when receiving a valid frame.
  ctx->flushed = 0;

  // Initialize the decoder worker on the first frame.
  if (ctx->frame_worker == NULL) {
    res = init_decoder(ctx);
    if (res != AOM_CODEC_OK) return res;
  }

  const uint8_t *data_start = data;
  const uint8_t *data_end = data + data_sz;

  if (ctx->is_annexb) {
    // read the size of this temporal unit
    size_t length_of_size;
    uint64_t temporal_unit_size;
    if (aom_uleb_decode(data_start, data_sz, &temporal_unit_size,
                        &length_of_size) != 0) {
      return AOM_CODEC_CORRUPT_FRAME;
    }
    data_start += length_of_size;
    if (temporal_unit_size > (size_t)(data_end - data_start))
      return AOM_CODEC_CORRUPT_FRAME;
    data_end = data_start + temporal_unit_size;
  }

  // Decode in serial mode.
  while (data_start < data_end) {
    uint64_t frame_size;
    if (ctx->is_annexb) {
      // read the size of this frame unit
      size_t length_of_size;
      if (aom_uleb_decode(data_start, (size_t)(data_end - data_start),
                          &frame_size, &length_of_size) != 0) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      data_start += length_of_size;
      if (frame_size > (size_t)(data_end - data_start))
        return AOM_CODEC_CORRUPT_FRAME;
    } else {
      frame_size = (uint64_t)(data_end - data_start);
    }

    res = decode_one(ctx, &data_start, (size_t)frame_size, user_priv);
    if (res != AOM_CODEC_OK) return res;

    // Allow extra zero bytes after the frame end
    while (data_start < data_end) {
      const uint8_t marker = data_start[0];
      if (marker) break;
      ++data_start;
    }
  }

  return res;
}